

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall
BuildWithLogTestDyndepBuildDiscoverRestat::Run(BuildWithLogTestDyndepBuildDiscoverRestat *this)

{
  State *state;
  VirtualFileSystem *this_00;
  int *piVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  int iVar2;
  Test *pTVar3;
  bool bVar4;
  Node *pNVar5;
  string err;
  allocator<char> local_9a;
  allocator<char> local_99;
  string local_98;
  string local_78;
  Builder *local_58;
  string local_50;
  
  iVar2 = g_current_test->assertion_failures_;
  state = &(this->super_BuildWithLogTest).super_BuildTest.super_StateTestWithBuiltinRules.state_;
  AssertParse(state,
              "rule true\n  command = true\nrule cp\n  command = cp $in $out\nbuild dd: cp dd-in\nbuild out1: true in || dd\n  dyndep = dd\nbuild out2: cat out1\n"
              ,(ManifestParserOptions)0x0);
  if (iVar2 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"out1",(allocator<char> *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_9a);
  this_00 = &(this->super_BuildWithLogTest).super_BuildTest.fs_;
  VirtualFileSystem::Create(this_00,&local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"out2",(allocator<char> *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_9a);
  VirtualFileSystem::Create(this_00,&local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"dd-in",(allocator<char> *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"ninja_dyndep_version = 1\nbuild out1: dyndep\n  restat = 1\n",
             &local_9a);
  VirtualFileSystem::Create(this_00,&local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  piVar1 = &(this->super_BuildWithLogTest).super_BuildTest.fs_.now_;
  *piVar1 = *piVar1 + 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"in",(allocator<char> *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_9a);
  VirtualFileSystem::Create(this_00,&local_78,&local_98);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  pTVar3 = g_current_test;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"out2",(allocator<char> *)&local_50);
  local_58 = &(this->super_BuildWithLogTest).super_BuildTest.builder_;
  pNVar5 = Builder::AddTarget(local_58,&local_98,&local_78);
  testing::Test::Check
            (pTVar3,pNVar5 != (Node *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
             ,0xbf5,"builder_.AddTarget(\"out2\", &err)");
  std::__cxx11::string::~string((string *)&local_98);
  pTVar3 = g_current_test;
  bVar4 = std::operator==("",&local_78);
  bVar4 = testing::Test::Check
                    (pTVar3,bVar4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                     ,0xbf6,"\"\" == err");
  pTVar3 = g_current_test;
  if (bVar4) {
    bVar4 = Builder::Build(local_58,&local_78);
    testing::Test::Check
              (pTVar3,bVar4,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0xbf7,"builder_.Build(&err)");
    pTVar3 = g_current_test;
    bVar4 = std::operator==("",&local_78);
    bVar4 = testing::Test::Check
                      (pTVar3,bVar4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0xbf8,"\"\" == err");
    if ((bVar4) &&
       (bVar4 = testing::Test::Check
                          (g_current_test,
                           (long)*(pointer *)
                                  ((long)&(this->super_BuildWithLogTest).super_BuildTest.
                                          command_runner_.commands_ran_.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data + 8) -
                           (long)(this->super_BuildWithLogTest).super_BuildTest.command_runner_.
                                 commands_ran_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start == 0x60,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0xbf9,"3u == command_runner_.commands_ran_.size()"),
       pTVar3 = g_current_test, bVar4)) {
      this_01 = &(this->super_BuildWithLogTest).super_BuildTest.command_runner_.commands_ran_;
      bVar4 = std::operator==("cp dd-in dd",
                              (this_01->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start);
      testing::Test::Check
                (pTVar3,bVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0xbfa,"\"cp dd-in dd\" == command_runner_.commands_ran_[0]");
      pTVar3 = g_current_test;
      bVar4 = std::operator==("true",(this_01->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start + 1);
      testing::Test::Check
                (pTVar3,bVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0xbfb,"\"true\" == command_runner_.commands_ran_[1]");
      pTVar3 = g_current_test;
      bVar4 = std::operator==("cat out1 > out2",
                              (this_01->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start + 2);
      testing::Test::Check
                (pTVar3,bVar4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0xbfc,"\"cat out1 > out2\" == command_runner_.commands_ran_[2]");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(this_01);
      State::Reset(state);
      piVar1 = &(this->super_BuildWithLogTest).super_BuildTest.fs_.now_;
      *piVar1 = *piVar1 + 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"in",&local_9a);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_99);
      VirtualFileSystem::Create(this_00,&local_98,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_98);
      pTVar3 = g_current_test;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"out2",(allocator<char> *)&local_50);
      pNVar5 = Builder::AddTarget(local_58,&local_98,&local_78);
      testing::Test::Check
                (pTVar3,pNVar5 != (Node *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0xc05,"builder_.AddTarget(\"out2\", &err)");
      std::__cxx11::string::~string((string *)&local_98);
      pTVar3 = g_current_test;
      bVar4 = std::operator==("",&local_78);
      bVar4 = testing::Test::Check
                        (pTVar3,bVar4,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0xc06,"\"\" == err");
      pTVar3 = g_current_test;
      if (bVar4) {
        bVar4 = Builder::Build(local_58,&local_78);
        testing::Test::Check
                  (pTVar3,bVar4,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                   ,0xc07,"builder_.Build(&err)");
        bVar4 = testing::Test::Check
                          (g_current_test,
                           (long)*(pointer *)
                                  ((long)&(this->super_BuildWithLogTest).super_BuildTest.
                                          command_runner_.commands_ran_.
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data + 8) -
                           (long)(this->super_BuildWithLogTest).super_BuildTest.command_runner_.
                                 commands_ran_.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start == 0x20,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                           ,0xc08,"1u == command_runner_.commands_ran_.size()");
        pTVar3 = g_current_test;
        if (bVar4) {
          bVar4 = std::operator==("true",(this_01->
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         )._M_impl.super__Vector_impl_data._M_start);
          testing::Test::Check
                    (pTVar3,bVar4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                     ,0xc09,"\"true\" == command_runner_.commands_ran_[0]");
          goto LAB_00131abf;
        }
      }
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_00131abf:
  std::__cxx11::string::~string((string *)&local_78);
  return;
}

Assistant:

TEST_F(BuildWithLogTest, DyndepBuildDiscoverRestat) {
  // Verify that a dyndep file can be built and loaded to discover
  // that an edge has a restat binding.
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule true\n"
"  command = true\n"
"rule cp\n"
"  command = cp $in $out\n"
"build dd: cp dd-in\n"
"build out1: true in || dd\n"
"  dyndep = dd\n"
"build out2: cat out1\n"));

  fs_.Create("out1", "");
  fs_.Create("out2", "");
  fs_.Create("dd-in",
"ninja_dyndep_version = 1\n"
"build out1: dyndep\n"
"  restat = 1\n"
);
  fs_.Tick();
  fs_.Create("in", "");

  // Do a pre-build so that there's commands in the log for the outputs,
  // otherwise, the lack of an entry in the build log will cause "out2" to
  // rebuild regardless of restat.
  string err;
  EXPECT_TRUE(builder_.AddTarget("out2", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ("", err);
  ASSERT_EQ(3u, command_runner_.commands_ran_.size());
  EXPECT_EQ("cp dd-in dd", command_runner_.commands_ran_[0]);
  EXPECT_EQ("true", command_runner_.commands_ran_[1]);
  EXPECT_EQ("cat out1 > out2", command_runner_.commands_ran_[2]);

  command_runner_.commands_ran_.clear();
  state_.Reset();
  fs_.Tick();
  fs_.Create("in", "");

  // We touched "in", so we should build "out1".  But because "true" does not
  // touch "out1", we should cancel the build of "out2".
  EXPECT_TRUE(builder_.AddTarget("out2", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
  EXPECT_EQ("true", command_runner_.commands_ran_[0]);
}